

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O3

void __thiscall
avro::NonUnionToUnionParser::parse(NonUnionToUnionParser *this,Reader *reader,uint8_t *address)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  
  *(size_t *)(address + this->choiceOffset_) = this->choice_;
  uVar2 = (**(code **)(address + this->setFuncOffset_))(address + this->offset_);
  peVar1 = (this->resolver_).px;
  UNRECOVERED_JUMPTABLE = *peVar1->_vptr_Resolver;
  (*UNRECOVERED_JUMPTABLE)(peVar1,reader,uVar2,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Reading non-union to union");

        int64_t *choice = reinterpret_cast<int64_t *>(address + choiceOffset_);
        *choice = choice_;
        GenericUnionSetter* setter = reinterpret_cast<GenericUnionSetter *> (address + setFuncOffset_);
        uint8_t *value = reinterpret_cast<uint8_t *> (address + offset_);
        uint8_t *location = (*setter)(value, choice_);

        resolver_->parse(reader, location);
    }